

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O1

void upb_Message_SetBaseFieldInt64(upb_Message *msg,upb_MiniTableField *f,int64_t value)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  
  bVar2 = f->descriptortype_dont_copy_me__upb_internal_use_only;
  bVar3 = f->mode_dont_copy_me__upb_internal_use_only;
  if ((bVar3 & 0x10) == 0) {
    uVar5 = (ulong)bVar2 - 1;
  }
  else {
    uVar5 = 0xd;
    if ((ulong)bVar2 != 5) {
      if (bVar2 != 0xc) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
      uVar5 = 8;
    }
  }
  if ((0x28004UL >> (uVar5 & 0x3f) & 1) == 0) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int64",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x27c,
                  "void upb_Message_SetBaseFieldInt64(struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  if ((bVar3 & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x27d,
                  "void upb_Message_SetBaseFieldInt64(struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  if (0xbf < bVar3) {
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x13b,
                    "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                   );
    }
    if ((bVar3 & 8) == 0) {
      uVar4 = f->presence;
      if (0 < (short)uVar4) {
        pbVar1 = (byte *)((long)&msg->field_0 + (ulong)(uVar4 >> 3));
        *pbVar1 = *pbVar1 | '\x01' << ((byte)uVar4 & 7);
        (*(code *)(&DAT_003a1224 +
                  *(int *)(&DAT_003a1224 +
                          (ulong)(f->mode_dont_copy_me__upb_internal_use_only >> 6) * 4)))
                  (msg,&DAT_003a1224 +
                       *(int *)(&DAT_003a1224 +
                               (ulong)(f->mode_dont_copy_me__upb_internal_use_only >> 6) * 4),value,
                   f->offset_dont_copy_me__upb_internal_use_only);
        return;
      }
      if ((short)uVar4 < 0) {
        *(uint32_t *)((long)&msg->field_0 + (ulong)(uVar4 ^ 0xffff)) =
             f->number_dont_copy_me__upb_internal_use_only;
      }
      (*(code *)(&DAT_003a1224 +
                *(int *)(&DAT_003a1224 +
                        (ulong)(f->mode_dont_copy_me__upb_internal_use_only >> 6) * 4)))
                (msg,&DAT_003a1224 +
                     *(int *)(&DAT_003a1224 +
                             (ulong)(f->mode_dont_copy_me__upb_internal_use_only >> 6) * 4),value,
                 f->offset_dont_copy_me__upb_internal_use_only);
      return;
    }
    __assert_fail("!upb_MiniTableField_IsExtension(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x13c,
                  "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                 );
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x27e,
                "void upb_Message_SetBaseFieldInt64(struct upb_Message *, const upb_MiniTableField *, int64_t)"
               );
}

Assistant:

UPB_API_INLINE void upb_Message_SetBaseFieldInt64(struct upb_Message* msg,
                                                  const upb_MiniTableField* f,
                                                  int64_t value) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int64);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_8Byte);
  upb_Message_SetBaseField(msg, f, &value);
}